

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.cpp
# Opt level: O2

void __thiscall ScopeNode::ScopeNode(ScopeNode *this)

{
  _Rb_tree_header *p_Var1;
  ScopeNode SStack_58;
  
  p_Var1 = &(this->symbols_)._M_t._M_impl.super__Rb_tree_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->symbols_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->enclosing_scope_ = (ScopeNode *)0x0;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->children_;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->children_;
  (this->children_).super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  _M_size = 0;
  SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header;
  SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  SStack_58.enclosing_scope_ = (ScopeNode *)0x0;
  SStack_58.children_.super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&SStack_58.children_;
  SStack_58.children_.super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  _M_size = 0;
  SStack_58.level_ = 0;
  SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       SStack_58.symbols_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  SStack_58.children_.super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       SStack_58.children_.super__List_base<ScopeNode_*,_std::allocator<ScopeNode_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  ~ScopeNode(&SStack_58);
  return;
}

Assistant:

ScopeNode::ScopeNode() : enclosing_scope_(nullptr) {
    ScopeNode(nullptr);
}